

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O1

Sfm_Ntk_t * Abc_NtkExtractMfs2(Abc_Ntk_t *pNtk,int iPivot)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  void *pvVar4;
  Vec_Str_t *vFixed;
  Vec_Ptr_t *pVVar5;
  Vec_Wec_t *vFanins;
  Vec_Int_t *pVVar6;
  char *__s;
  Vec_Wrd_t *vTruths;
  word *pwVar7;
  Vec_Wrd_t *vTruths2;
  word *pwVar8;
  long lVar9;
  word wVar10;
  ulong uVar11;
  Vec_Ptr_t *pVVar12;
  long lVar13;
  int *piVar14;
  Sfm_Ntk_t *pSVar15;
  int iVar16;
  ulong uVar17;
  size_t __n;
  uint uVar18;
  word (*TruthStore_00) [1024];
  int nTotal;
  Vec_Str_t *pVStack_220d8;
  Vec_Int_t *pVStack_220d0;
  long lStack_220c8;
  void **ppvStack_220c0;
  word *pTruths [16];
  word pCube [1024];
  word TruthStore [16] [1024];
  
  TruthStore_00 = TruthStore;
  pVVar6 = (Vec_Int_t *)0x0;
  memset(TruthStore_00,0,0x20000);
  pTruths[0xe] = (word *)0x0;
  pTruths[0xf] = (word *)0x0;
  pTruths[0xc] = (word *)0x0;
  pTruths[0xd] = (word *)0x0;
  pTruths[10] = (word *)0x0;
  pTruths[0xb] = (word *)0x0;
  pTruths[8] = (word *)0x0;
  pTruths[9] = (word *)0x0;
  pTruths[6] = (word *)0x0;
  pTruths[7] = (word *)0x0;
  pTruths[4] = (word *)0x0;
  pTruths[5] = (word *)0x0;
  pTruths[2] = (word *)0x0;
  pTruths[3] = (word *)0x0;
  pTruths[0] = (word *)0x0;
  pTruths[1] = (word *)0x0;
  memset(pCube,0,0x2000);
  nTotal = 0;
  pVVar5 = Abc_NtkAssignIDs2(pNtk);
  lStack_220c8 = (long)pVVar5->nSize;
  __n = (long)pNtk->vCos->nSize + pNtk->vCis->nSize + lStack_220c8;
  vFanins = (Vec_Wec_t *)malloc(0x10);
  iVar1 = (int)__n;
  iVar16 = 8;
  if (6 < iVar1 - 1U) {
    iVar16 = iVar1;
  }
  vFanins->nSize = 0;
  vFanins->nCap = iVar16;
  if (iVar16 != 0) {
    pVVar6 = (Vec_Int_t *)calloc((long)iVar16,0x10);
  }
  vFanins->pArray = pVVar6;
  vFanins->nSize = iVar1;
  pVStack_220d8 = (Vec_Str_t *)malloc(0x10);
  iVar16 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar16 = iVar1;
  }
  pVStack_220d8->nSize = 0;
  pVStack_220d8->nCap = iVar16;
  if (iVar16 == 0) {
    __s = (char *)0x0;
  }
  else {
    __s = (char *)malloc((long)iVar16);
  }
  pVStack_220d8->pArray = __s;
  pVStack_220d8->nSize = iVar1;
  pwVar7 = (word *)0x0;
  memset(__s,0,__n);
  vTruths = (Vec_Wrd_t *)malloc(0x10);
  vTruths->nSize = 0;
  vTruths->nCap = iVar16;
  if (iVar16 != 0) {
    pwVar7 = (word *)malloc((long)iVar16 << 3);
  }
  vTruths->pArray = pwVar7;
  vTruths->nSize = iVar1;
  pwVar8 = (word *)0x0;
  memset(pwVar7,0,__n * 8);
  pVStack_220d0 = Abc_NtkAssignStarts(pNtk,pVVar5,&nTotal);
  iVar1 = nTotal;
  vTruths2 = (Vec_Wrd_t *)malloc(0x10);
  iVar16 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar16 = iVar1;
  }
  vTruths2->nSize = 0;
  vTruths2->nCap = iVar16;
  if (iVar16 != 0) {
    pwVar8 = (word *)malloc((long)iVar16 << 3);
  }
  vTruths2->pArray = pwVar8;
  Abc_NtkFillTruthStore(TruthStore_00);
  lVar9 = 0;
  do {
    pTruths[lVar9] = *TruthStore_00;
    lVar9 = lVar9 + 1;
    TruthStore_00 = TruthStore_00 + 1;
  } while (lVar9 != 0x10);
  if (0 < (int)lStack_220c8) {
    ppvStack_220c0 = pVVar5->pArray;
    lVar9 = 0;
    do {
      plVar3 = (long *)ppvStack_220c0[lVar9];
      iVar1 = *(int *)((long)plVar3 + 0x1c);
      if (iVar1 < 7) {
        wVar10 = Abc_SopToTruth((char *)plVar3[7],iVar1);
        iVar1 = (int)plVar3[8];
        if (((long)iVar1 < 0) || (vTruths->nSize <= iVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                        ,0x1cf,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
        }
        vTruths->pArray[iVar1] = wVar10;
        if (wVar10 - 1 < 0xfffffffffffffffe) {
LAB_002dfbaf:
          lVar13 = (long)(int)plVar3[8];
          if ((lVar13 < 0) || (vFanins->nSize <= (int)plVar3[8])) goto LAB_002dfde3;
          pVVar6 = vFanins->pArray + lVar13;
          iVar1 = *(int *)((long)plVar3 + 0x1c);
          if (vFanins->pArray[lVar13].nCap < iVar1) {
            if (pVVar6->pArray == (int *)0x0) {
              piVar14 = (int *)malloc((long)iVar1 << 2);
            }
            else {
              piVar14 = (int *)realloc(pVVar6->pArray,(long)iVar1 << 2);
            }
            pVVar6->pArray = piVar14;
            if (piVar14 == (int *)0x0) goto LAB_002dfe5f;
            pVVar6->nCap = iVar1;
          }
          if (0 < *(int *)((long)plVar3 + 0x1c)) {
            lVar13 = 0;
            do {
              Vec_IntPush(pVVar6,*(int *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                                   (long)*(int *)(plVar3[4] + lVar13 * 4) * 8) +
                                         0x40));
              lVar13 = lVar13 + 1;
            } while (lVar13 < *(int *)((long)plVar3 + 0x1c));
          }
        }
      }
      else {
        iVar16 = iVar1 + -6;
        uVar18 = 1 << ((byte)iVar16 & 0x1f);
        iVar2 = (int)plVar3[8];
        if (((long)iVar2 < 0) || (pVStack_220d0->nSize <= iVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar2 = pVStack_220d0->pArray[iVar2];
        if (((long)iVar2 < 0) || (vTruths2->nSize <= iVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        pwVar7 = vTruths2->pArray + iVar2;
        Abc_SopToTruthBig((char *)plVar3[7],iVar1,pTruths,pCube,pwVar7);
        uVar11 = 0;
        if (iVar16 != 0x1f) {
          uVar11 = 1;
          if (1 < (int)uVar18) {
            uVar11 = (ulong)uVar18;
          }
          uVar17 = 0;
          do {
            if (pwVar7[uVar17] != 0) {
              uVar11 = uVar17 & 0xffffffff;
              break;
            }
            uVar17 = uVar17 + 1;
          } while (uVar11 != uVar17);
        }
        if ((uint)uVar11 != uVar18) {
          uVar11 = 0;
          if (iVar16 != 0x1f) {
            uVar11 = 1;
            if (1 < (int)uVar18) {
              uVar11 = (ulong)uVar18;
            }
            uVar17 = 0;
            do {
              if (pwVar7[uVar17] != 0xffffffffffffffff) {
                uVar11 = uVar17 & 0xffffffff;
                break;
              }
              uVar17 = uVar17 + 1;
            } while (uVar11 != uVar17);
          }
          if ((uint)uVar11 != uVar18) goto LAB_002dfbaf;
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != lStack_220c8);
  }
  pVVar12 = pNtk->vCos;
  if (0 < pVVar12->nSize) {
    lVar9 = 0;
    do {
      plVar3 = (long *)pVVar12->pArray[lVar9];
      lVar13 = (long)(int)plVar3[8];
      if ((lVar13 < 0) || (vFanins->nSize <= (int)plVar3[8])) {
LAB_002dfde3:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar6 = vFanins->pArray + lVar13;
      iVar1 = *(int *)((long)plVar3 + 0x1c);
      if (vFanins->pArray[lVar13].nCap < iVar1) {
        if (pVVar6->pArray == (int *)0x0) {
          piVar14 = (int *)malloc((long)iVar1 << 2);
        }
        else {
          piVar14 = (int *)realloc(pVVar6->pArray,(long)iVar1 << 2);
        }
        pVVar6->pArray = piVar14;
        if (piVar14 == (int *)0x0) {
LAB_002dfe5f:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        pVVar6->nCap = iVar1;
      }
      if (0 < *(int *)((long)plVar3 + 0x1c)) {
        lVar13 = 0;
        do {
          Vec_IntPush(pVVar6,*(int *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                               (long)*(int *)(plVar3[4] + lVar13 * 4) * 8) + 0x40));
          lVar13 = lVar13 + 1;
        } while (lVar13 < *(int *)((long)plVar3 + 0x1c));
      }
      lVar9 = lVar9 + 1;
      pVVar12 = pNtk->vCos;
    } while (lVar9 < pVVar12->nSize);
  }
  if (pVVar5->pArray != (void **)0x0) {
    free(pVVar5->pArray);
    pVVar5->pArray = (void **)0x0;
  }
  vFixed = pVStack_220d8;
  if (pVVar5 != (Vec_Ptr_t *)0x0) {
    free(pVVar5);
  }
  pVVar5 = pNtk->vObjs;
  if (0 < pVVar5->nSize) {
    lVar9 = 0;
    do {
      pvVar4 = pVVar5->pArray[lVar9];
      if (((pvVar4 != (void *)0x0) && (iPivot <= lVar9)) &&
         ((*(uint *)((long)pvVar4 + 0x14) & 0xf) == 7)) {
        iVar1 = *(int *)((long)pvVar4 + 0x40);
        if (((long)iVar1 < 0) || (vFixed->nSize <= iVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                        ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
        }
        vFixed->pArray[iVar1] = '\x01';
      }
      lVar9 = lVar9 + 1;
      pVVar5 = pNtk->vObjs;
    } while (lVar9 < pVVar5->nSize);
  }
  pSVar15 = Sfm_NtkConstruct(vFanins,pNtk->vCis->nSize,pNtk->vCos->nSize,vFixed,(Vec_Str_t *)0x0,
                             vTruths,pVStack_220d0,vTruths2);
  return pSVar15;
}

Assistant:

Sfm_Ntk_t * Abc_NtkExtractMfs2( Abc_Ntk_t * pNtk, int iPivot )
{
    word TruthStore[16][1<<10] = {{0}}, * pTruths[16] = {NULL}, pCube[1<<10] = {0};
    Vec_Ptr_t * vNodes;
    Vec_Wec_t * vFanins;
    Vec_Str_t * vFixed;
    Vec_Wrd_t * vTruths;
    Vec_Int_t * vArray;
    Vec_Int_t * vStarts;
    Vec_Wrd_t * vTruths2;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, nObjs, nTotal = 0;
    vNodes  = Abc_NtkAssignIDs2(pNtk);
    nObjs   = Abc_NtkCiNum(pNtk) + Vec_PtrSize(vNodes) + Abc_NtkCoNum(pNtk);
    vFanins = Vec_WecStart( nObjs );
    vFixed  = Vec_StrStart( nObjs );
    vTruths = Vec_WrdStart( nObjs );
    vStarts = Abc_NtkAssignStarts( pNtk, vNodes, &nTotal );
    vTruths2= Vec_WrdAlloc( nTotal );
    Abc_NtkFillTruthStore( TruthStore );
    for ( i = 0; i < 16; i++ )
        pTruths[i] = TruthStore[i];
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        if ( Abc_ObjFaninNum(pObj) <= 6 )
        {
            word uTruth = Abc_SopToTruth((char *)pObj->pData, Abc_ObjFaninNum(pObj));
            Vec_WrdWriteEntry( vTruths, pObj->iTemp, uTruth );
            if ( uTruth == 0 || ~uTruth == 0 )
                continue;
        }
        else
        {
            int nWords  = Abc_Truth6WordNum( Abc_ObjFaninNum(pObj) );
            int Offset  = Vec_IntEntry( vStarts, pObj->iTemp );
            word * pRes = Vec_WrdEntryP( vTruths2, Offset );
            Abc_SopToTruthBig( (char *)pObj->pData, Abc_ObjFaninNum(pObj), pTruths, pCube, pRes );
            // check const0
            for ( k = 0; k < nWords; k++ )
                if ( pRes[k] )
                    break;
            if ( k == nWords )
                continue;
            // check const1
            for ( k = 0; k < nWords; k++ )
                if ( ~pRes[k] )
                    break;
            if ( k == nWords )
                continue;
        }
        vArray = Vec_WecEntry( vFanins, pObj->iTemp );
        Vec_IntGrow( vArray, Abc_ObjFaninNum(pObj) );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vArray, pFanin->iTemp );
    }
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        vArray = Vec_WecEntry( vFanins, pObj->iTemp );
        Vec_IntGrow( vArray, Abc_ObjFaninNum(pObj) );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vArray, pFanin->iTemp );
    }
    Vec_PtrFree( vNodes );
    // set fixed attributes
    Abc_NtkForEachNode( pNtk, pObj, i )
        if ( i >= iPivot )
            Vec_StrWriteEntry( vFixed, pObj->iTemp, (char)1 );
    return Sfm_NtkConstruct( vFanins, Abc_NtkCiNum(pNtk), Abc_NtkCoNum(pNtk), vFixed, NULL, vTruths, vStarts, vTruths2 );
}